

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

IO * __thiscall adios2::core::ADIOS::AtIO(ADIOS *this,string *name)

{
  bool bVar1;
  iterator iVar2;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
          ::find(&(this->m_IOs)._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_IOs)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"ADIOS",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"AtIO",&local_bb);
    std::operator+(&local_b8,"IO ",name);
    std::operator+(&local_98,&local_b8," being used is not declared");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
  }
  else {
    bVar1 = IO::IsDeclared((IO *)(iVar2._M_node + 2));
    if (bVar1) goto LAB_003e8cee;
    std::__cxx11::string::string((string *)&local_38,"Core",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"ADIOS",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"AtIO",&local_bb);
    std::operator+(&local_b8,"IO ",name);
    std::operator+(&local_98,&local_b8," being used is not declared");
    helper::Throw<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
LAB_003e8cee:
  return (IO *)(iVar2._M_node + 2);
}

Assistant:

IO &ADIOS::AtIO(const std::string name)
{
    auto itIO = m_IOs.find(name);

    if (itIO == m_IOs.end())
    {
        helper::Throw<std::invalid_argument>("Core", "ADIOS", "AtIO",
                                             "IO " + name + " being used is not declared");
    }
    else
    {
        if (!itIO->second.IsDeclared())
        {
            helper::Throw<std::invalid_argument>("Core", "ADIOS", "AtIO",
                                                 "IO " + name + " being used is not declared");
        }
    }

    return itIO->second;
}